

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateStaticVariables
          (ImmutableMessageLiteGenerator *this,Printer *printer,int *bytecode_estimate)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageLiteGenerator local_70;
  
  lVar3 = 0;
  for (lVar2 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar2 < *(int *)(pDVar1 + 0x48); lVar2 = lVar2 + 1) {
    ImmutableMessageLiteGenerator
              (&local_70,(Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar3),this->context_);
    GenerateStaticVariables(&local_70,printer,bytecode_estimate);
    ~ImmutableMessageLiteGenerator(&local_70);
    lVar3 = lVar3 + 0xa8;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateStaticVariables(
    io::Printer* printer, int* bytecode_estimate) {
  // Generate static members for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateStaticVariables(printer, bytecode_estimate);
  }
}